

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

void filter(qnode_ptr_t p,qnode_ptr_t q,float trsh)

{
  disp_vect_t *pdVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  param_t *ppVar4;
  undefined4 in_XMM0_Db;
  int local_4c;
  int local_48;
  int j;
  int i;
  disp_vect_t Uerr;
  param_t P;
  float trsh_local;
  qnode_ptr_t q_local;
  qnode_ptr_t p_local;
  
  for (local_48 = 0; local_48 < p->sizy; local_48 = local_48 + 1) {
    for (local_4c = 0; local_4c < p->sizx; local_4c = local_4c + 1) {
      ppVar4 = *q->param_ptr[q->sizz / 2] + (q->res * local_48 + local_4c);
      uVar2 = ppVar4->mag;
      uVar3 = ppVar4->err;
      if (((float)uVar2 <= (float)(double)CONCAT44(in_XMM0_Db,trsh)) || ((float)uVar3 != 0.0)) {
        pdVar1 = *p->flow_ptr + (p->res * local_48 + local_4c);
        pdVar1->x = -100.0;
        pdVar1->y = 100.0;
      }
    }
  }
  return;
}

Assistant:

void filter(p,q,trsh)
qnode_ptr_t p, q ;
float trsh ;

{ param_t P ;
  disp_vect_t Uerr ;
  int i, j ;

  Uerr.x = -100.0 ;
  Uerr.y = 100.0 ;

  for (i = 0 ; i < p->sizy ; i++) {
    for (j = 0 ; j < p->sizx ; j++) {
      P = (*q->param_ptr[q->sizz/2])[q->res*i + j] ;
      if (P.mag <= trsh || P.err != NO_ERROR) {
        (*p->flow_ptr)[p->res*i + j] = Uerr ;
      }
    }
  }
}